

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  reference extraout_RAX;
  reference extraout_RAX_00;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
    ::iterator::operator*((iterator *)this);
  }
  else if (pcVar1 != kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar1) {
      return (reference)(this->field_1).slot_;
    }
    goto LAB_002479b2;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::iterator::operator*((iterator *)this);
LAB_002479b2:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::iterator::operator*((iterator *)this);
  if ((DescriptorPool *)this != (DescriptorPool *)0x0) {
    google::protobuf::DescriptorPool::~DescriptorPool((DescriptorPool *)this);
    operator_delete(this,0x78);
    return extraout_RAX_00;
  }
  return extraout_RAX;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }